

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O1

size_t __thiscall
CoreML::Specification::TreeEnsembleParameters::ByteSizeLong(TreeEnsembleParameters *this)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Type *this_00;
  size_t sVar5;
  ulong uVar6;
  uint index;
  ulong uVar7;
  
  uVar4 = (this->nodes_).super_RepeatedPtrFieldBase.current_size_;
  uVar7 = (ulong)uVar4;
  if (uVar7 == 0) {
    uVar7 = 0;
  }
  else {
    index = 0;
    do {
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode>::TypeHandler>
                          (&(this->nodes_).super_RepeatedPtrFieldBase,index);
      sVar5 = TreeEnsembleParameters_TreeNode::ByteSizeLong(this_00);
      uVar3 = (uint)sVar5 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar7 = uVar7 + sVar5 + (ulong)(iVar2 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (uVar4 != index);
  }
  uVar6 = (ulong)(uint)(this->basepredictionvalue_).current_size_;
  lVar1 = uVar6 * 8;
  uVar4 = (uint)lVar1;
  if (uVar6 != 0) {
    if ((int)uVar4 < 0) {
      uVar6 = 0xb;
    }
    else {
      iVar2 = 0x1f;
      if ((uVar4 | 1) != 0) {
        for (; (uVar4 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar6 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
    }
    uVar7 = uVar7 + uVar6;
  }
  this->_basepredictionvalue_cached_byte_size_ = uVar4;
  sVar5 = uVar7 + lVar1;
  if (this->numpredictiondimensions_ != 0) {
    uVar7 = this->numpredictiondimensions_ | 1;
    lVar1 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar5 = sVar5 + ((int)lVar1 * 9 + 0x49U >> 6) + 1;
  }
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

size_t TreeEnsembleParameters::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.TreeEnsembleParameters)
  size_t total_size = 0;

  // repeated .CoreML.Specification.TreeEnsembleParameters.TreeNode nodes = 1;
  {
    unsigned int count = this->nodes_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->nodes(i));
    }
  }

  // repeated double basePredictionValue = 3;
  {
    unsigned int count = this->basepredictionvalue_size();
    size_t data_size = 8UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _basepredictionvalue_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // uint64 numPredictionDimensions = 2;
  if (this->numpredictiondimensions() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->numpredictiondimensions());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}